

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_cvars.cpp
# Opt level: O0

void __thiscall FBaseCVar::SetGenericRep(FBaseCVar *this,UCVarValue value,ECVarType type)

{
  undefined1 local_38 [8];
  FLatchedValue latch;
  ECVarType type_local;
  FBaseCVar *this_local;
  UCVarValue value_local;
  
  if (((this->Flags & 8) == 0) || (!m_DoNoSet)) {
    latch._20_4_ = type;
    if (((this->Flags & 0x10) == 0) || ((gamestate == GS_FULLCONSOLE || (gamestate == GS_STARTUP))))
    {
      if (((this->Flags & 4) == 0) || ((gamestate == GS_STARTUP || (demoplayback)))) {
        ForceSet(this,value,type,false);
      }
      else if ((netgame) && (((&DAT_01ae7251)[(long)consoleplayer * 0x2a0] & 1) == 0)) {
        Printf("Only setting controllers can change %s\n",this->Name);
      }
      else {
        D_SendServerInfoChange(this,value,type);
      }
    }
    else {
      local_38 = (undefined1  [8])this;
      latch.Variable = (FBaseCVar *)value;
      latch.Value.Int = type;
      if (type == CVAR_String) {
        latch.Variable = (FBaseCVar *)copystring(value.String);
      }
      TArray<FLatchedValue,_FLatchedValue>::Push(&LatchedValues,(FLatchedValue *)local_38);
    }
  }
  return;
}

Assistant:

void FBaseCVar::SetGenericRep (UCVarValue value, ECVarType type)
{
	if ((Flags & CVAR_NOSET) && m_DoNoSet)
	{
		return;
	}
	else if ((Flags & CVAR_LATCH) && gamestate != GS_FULLCONSOLE && gamestate != GS_STARTUP)
	{
		FLatchedValue latch;

		latch.Variable = this;
		latch.Type = type;
		if (type != CVAR_String)
			latch.Value = value;
		else
			latch.Value.String = copystring(value.String);
		LatchedValues.Push (latch);
	}
	else if ((Flags & CVAR_SERVERINFO) && gamestate != GS_STARTUP && !demoplayback)
	{
		if (netgame && !players[consoleplayer].settings_controller)
		{
			Printf ("Only setting controllers can change %s\n", Name);
			return;
		}
		D_SendServerInfoChange (this, value, type);
	}
	else
	{
		ForceSet (value, type);
	}
}